

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O0

void __thiscall
DIS::ResupplyReceivedPdu::unmarshal(ResupplyReceivedPdu *this,DataStream *dataStream)

{
  undefined1 local_40 [8];
  SupplyQuantity x;
  size_t idx;
  DataStream *dataStream_local;
  ResupplyReceivedPdu *this_local;
  
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_receivingEntityID,dataStream);
  EntityID::unmarshal(&this->_supplyingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfSupplyTypes);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  x._quantity = 0.0;
  x._28_4_ = 0;
  for (; (ulong)x._24_8_ < (ulong)this->_numberOfSupplyTypes; x._24_8_ = x._24_8_ + 1) {
    SupplyQuantity::SupplyQuantity((SupplyQuantity *)local_40);
    SupplyQuantity::unmarshal((SupplyQuantity *)local_40,dataStream);
    std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::push_back
              (&this->_supplies,(value_type *)local_40);
    SupplyQuantity::~SupplyQuantity((SupplyQuantity *)local_40);
  }
  return;
}

Assistant:

void ResupplyReceivedPdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _receivingEntityID.unmarshal(dataStream);
    _supplyingEntityID.unmarshal(dataStream);
    dataStream >> _numberOfSupplyTypes;
    dataStream >> _padding1;
    dataStream >> _padding2;

     _supplies.clear();
     for(size_t idx = 0; idx < _numberOfSupplyTypes; idx++)
     {
        SupplyQuantity x;
        x.unmarshal(dataStream);
        _supplies.push_back(x);
     }
}